

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCAPropBag.cpp
# Opt level: O0

HRESULT __thiscall Js::SCAPropBag::QueryInterface(SCAPropBag *this,IID *riid,void **ppv)

{
  int iVar1;
  void **ppv_local;
  IID *riid_local;
  SCAPropBag *this_local;
  
  if (ppv == (void **)0x0) {
    this_local._4_4_ = -0x7fffbffd;
  }
  else {
    iVar1 = IsEqualGUID(riid,&IID_IUnknown);
    if (iVar1 == 0) {
      *ppv = (void *)0x0;
      this_local._4_4_ = -0x7fffbffe;
    }
    else {
      *ppv = this;
      AddRef(this);
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

STDMETHODIMP SCAPropBag::QueryInterface(REFIID riid, void** ppv)
    {
        if (ppv == nullptr)
        {
            return E_POINTER;
        }

        if (IsEqualGUID(riid, IID_IUnknown))
        {
            *ppv = static_cast<IUnknown*>(this);
            AddRef();
            return S_OK;
        }

        *ppv = nullptr;
        return E_NOINTERFACE;
    }